

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::FieldDescriptorProto> *fields,
               FlatAllocator *alloc)

{
  TypeMap<google::protobuf::(anonymous_namespace)::IntT,_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *pTVar1;
  Base<google::protobuf::FieldOptions> *pBVar2;
  int iVar3;
  FieldDescriptorProto *this;
  PointerT<char> pcVar4;
  bool bVar5;
  FieldNameCase FVar6;
  void **ppvVar7;
  const_iterator cVar8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  char *pcVar10;
  char *extraout_RDX;
  undefined8 uVar11;
  string *psVar12;
  undefined8 in_R8;
  string *psVar13;
  string_view name;
  string_view input;
  string_view input_00;
  undefined8 local_d8;
  undefined8 local_d0;
  size_type local_c8;
  pointer local_c0;
  size_type local_b8;
  pointer local_b0;
  size_type local_a8;
  pointer local_a0;
  undefined1 local_98 [8];
  string json_name;
  string camelcase_name;
  string lowercase_name;
  
  if ((alloc->
      super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) {
LAB_001d4b36:
    uVar11 = 0x180;
LAB_001d4b54:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
               ,uVar11,0x10,"!has_allocated()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_d8);
  }
  pTVar1 = &(alloc->
            super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
            ).total_;
  (pTVar1->payload_).super_Base<char>.value =
       (pTVar1->payload_).super_Base<char>.value +
       (fields->super_RepeatedPtrFieldBase).current_size_ * 0x58;
  ppvVar7 = internal::RepeatedPtrFieldBase::elements(&fields->super_RepeatedPtrFieldBase);
  cVar8 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(fields);
  do {
    if (ppvVar7 == cVar8.it_) {
      return;
    }
    this = (FieldDescriptorProto *)*ppvVar7;
    bVar5 = FieldDescriptorProto::has_options(this);
    if (bVar5) {
      if ((alloc->
          super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
          ).pointers_.payload_.super_Base<char>.value != (PointerT<char>)0x0) goto LAB_001d4b36;
      pBVar2 = &(alloc->
                super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                ).total_.payload_.super_Base<google::protobuf::FieldOptions>;
      pBVar2->value = pBVar2->value + 1;
    }
    psVar13 = (string *)((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar4 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).pointers_.payload_.super_Base<char>.value;
    if ((undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x10) ==
        (undefined1  [80])0x0) {
      if (pcVar4 != (PointerT<char>)0x0) {
LAB_001d4b16:
        uVar11 = 0x1ae;
        goto LAB_001d4b54;
      }
LAB_001d4998:
      name._M_str = extraout_RDX;
      name._M_len = *(size_t *)psVar13;
      FVar6 = anon_unknown_23::
              FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
              ::GetFieldNameCase(*(FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                   **)(psVar13 + 8),name);
      if (FVar6 == 1) {
        iVar3 = 3;
      }
      else {
        if (FVar6 != 0) {
          bVar5 = true;
          psVar12 = (string *)0x0;
          goto LAB_001d49ca;
        }
        iVar3 = 2;
      }
      (anonymous_namespace)::
      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
      ::PlanArray<std::__cxx11::string>
                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  *)alloc,iVar3);
    }
    else {
      if (pcVar4 != (PointerT<char>)0x0) goto LAB_001d4b16;
      psVar12 = (string *)
                ((ulong)(this->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      if (psVar12 == (string *)0x0) goto LAB_001d4998;
      bVar5 = false;
LAB_001d49ca:
      std::__cxx11::string::string((string *)&lowercase_name,psVar13);
      absl::lts_20240722::AsciiStrToLower((string *)&lowercase_name);
      pcVar10 = (char *)0x1;
      input._M_str = (char *)0x1;
      input._M_len = *(size_t *)psVar13;
      (anonymous_namespace)::ToCamelCase_abi_cxx11_
                (&camelcase_name,*(_anonymous_namespace_ **)(psVar13 + 8),input,SUB81(in_R8,0));
      if (bVar5) {
        input_00._M_str = pcVar10;
        input_00._M_len = *(size_t *)psVar13;
        (anonymous_namespace)::ToJsonName_abi_cxx11_
                  (&json_name,*(_anonymous_namespace_ **)(psVar13 + 8),input_00);
      }
      else {
        std::__cxx11::string::string((string *)&json_name,psVar12);
      }
      local_d0 = *(undefined8 *)psVar13;
      local_d8 = *(undefined8 *)(psVar13 + 8);
      local_c8 = lowercase_name._M_string_length;
      local_c0 = lowercase_name._M_dataplus._M_p;
      local_b8 = camelcase_name._M_string_length;
      local_b0 = camelcase_name._M_dataplus._M_p;
      local_a8 = json_name._M_string_length;
      local_a0 = json_name._M_dataplus._M_p;
      std::
      __sort<std::basic_string_view<char,std::char_traits<char>>*,__gnu_cxx::__ops::_Iter_less_iter>
                (&local_d8,local_98);
      pbVar9 = std::
               __unique<std::basic_string_view<char,std::char_traits<char>>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (&local_d8,local_98);
      (anonymous_namespace)::
      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
      ::PlanArray<std::__cxx11::string>
                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  *)alloc,(int)((ulong)((long)pbVar9 - (long)&local_d8) >> 4) + 1);
      std::__cxx11::string::~string((string *)&json_name);
      std::__cxx11::string::~string((string *)&camelcase_name);
      std::__cxx11::string::~string((string *)&lowercase_name);
    }
    if (((~(this->field_0)._impl_._has_bits_.has_bits_[0] & 0x408) == 0) &&
       ((iVar3 = (this->field_0)._impl_.type_, iVar3 == 0xc || (iVar3 == 9)))) {
      (anonymous_namespace)::
      FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
      ::PlanArray<std::__cxx11::string>
                ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  *)alloc,1);
    }
    ppvVar7 = ppvVar7 + 1;
  } while( true );
}

Assistant:

bool has_allocated() const {
    return pointers_.template Get<char>() != nullptr;
  }